

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressionTables.cpp
# Opt level: O1

void testDWAQuantize(string *tempdir)

{
  float fVar1;
  int be;
  long lVar2;
  long lVar3;
  float quantlevel;
  
  lVar2 = 0;
  do {
    fVar1 = (float)L"8ccccc/Bcccccccccccccccccccccccccccccccccccccc"[lVar2 + 0x2e];
    lVar3 = 0;
    do {
      testQuantizer(((float)*(int *)((long)&DAT_00185d50 + lVar3) * (fVar1 / 100000.0)) / 10.0);
      testQuantizer(((float)*(int *)((long)&DAT_00185e50 + lVar3) * (fVar1 / 100000.0)) / 17.0);
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x100);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 9);
  testQuantizer(0.00048875);
  testQuantizer(0.00782075);
  testQuantizer(0.007821);
  testQuantizer(0.0078155);
  testQuantizer(0.00781375);
  testQuantizer(0.00782);
  testQuantizer(0.0078165);
  testQuantizer(0.0009765);
  testQuantizer(0.0012441176);
  testQuantizer(0.0017470588);
  testQuantizer(0.002620588);
  testQuantizer(0.0010800001);
  return;
}

Assistant:

void testDWAQuantize (const std::string& tempdir)
{
    int jpegQuantTableY[] = {
        16, 11, 10, 16, 24,  40,  51,  61,  12, 12, 14, 19, 26,  58,  60,  55,
        14, 13, 16, 24, 40,  57,  69,  56,  14, 17, 22, 29, 51,  87,  80,  62,
        18, 22, 37, 56, 68,  109, 103, 77,  24, 35, 55, 64, 81,  104, 113, 92,
        49, 64, 78, 87, 103, 121, 120, 101, 72, 92, 95, 98, 112, 100, 103, 99};

    int jpegQuantTableYMin = 10;

    int jpegQuantTableCbCr[] = {
        17, 18, 24, 47, 99, 99, 99, 99, 18, 21, 26, 66, 99, 99, 99, 99,
        24, 26, 56, 99, 99, 99, 99, 99, 47, 66, 99, 99, 99, 99, 99, 99,
        99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99,
        99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99};

    int jpegQuantTableCbCrMin = 17;
//#define EXHAUSTING_TEST
#ifdef EXHAUSTING_TEST
    // the qscale is limited 0 - 100 in the set dwa compression level routine
    // in the library, so shouldn't have to test outside that range...
    for (float qscale = 0.f; qscale <= 100.f; qscale += 0.25f)
    {
        for ( int i = 0; i < 64; ++i )
        {
            // dwa encoder takes compression level and divides by 100000 to
            // get quantisation scale
            float quantlevel = qscale / 100000.f;

            testQuantizer (quantlevel * (float)(jpegQuantTableY[i]) / ((float)(jpegQuantTableYMin)));

            testQuantizer (quantlevel * (float)(jpegQuantTableCbCr[i]) / ((float)(jpegQuantTableCbCrMin)));
        }
    }
#else
    float baseErrors[] = { 0.f, 1.f, 20.f, 45.f /*default*/, 60.f, 73.f, 95.f, 100.f, 230.f };

    for ( int be = 0; be < static_cast<int> (sizeof(baseErrors)/sizeof(float)); ++be )
    {
        for ( int i = 0; i < 64; ++i )
        {
            // dwa encoder takes compression level and divides by 100000 to
            // get quantisation scale
            float quantlevel = baseErrors[be] / 100000.f;

            testQuantizer (quantlevel * (float)(jpegQuantTableY[i]) / ((float)(jpegQuantTableYMin)));

            testQuantizer (quantlevel * (float)(jpegQuantTableCbCr[i]) / ((float)(jpegQuantTableCbCrMin)));
        }
    }
    // particular edge cases previously
    testQuantizer (0.00048875);
    testQuantizer (0.00782075);
    testQuantizer (0.007821);
    testQuantizer (0.0078155);
    testQuantizer (0.00781375);
    testQuantizer (0.00782);
    testQuantizer (0.0078165);
    testQuantizer (0.0009765);
    testQuantizer (0.001244117622);
    testQuantizer (0.001747058821);
    testQuantizer (0.002620588057);
    testQuantizer (0.001080000075);
#endif
}